

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

void __thiscall
wallet::LegacyDataSPKM::LoadKeyPool(LegacyDataSPKM *this,int64_t nIndex,CKeyPool *keypool)

{
  int64_t iVar1;
  mapped_type_conflict1 *pmVar2;
  const_iterator cVar3;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock37;
  CKeyID keyid;
  int64_t local_c8;
  unique_lock<std::recursive_mutex> local_c0;
  CKeyMetadata local_b0;
  CKeyID local_3c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_c0._M_device = &(this->super_FillableSigningProvider).cs_KeyStore.super_recursive_mutex;
  local_c0._M_owns = false;
  local_c8 = nIndex;
  std::unique_lock<std::recursive_mutex>::lock(&local_c0);
  lVar4 = 0x290;
  if ((keypool->fInternal & 1U) != 0) {
    lVar4 = 0x260;
  }
  lVar5 = 0x2c0;
  if (keypool->m_pre_split == false) {
    lVar5 = lVar4;
  }
  std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
  _M_insert_unique<long_const&>
            ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
             ((long)&(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan + lVar5),&local_c8);
  iVar1 = local_c8;
  lVar4 = this->m_max_keypool_index;
  if (this->m_max_keypool_index <= local_c8) {
    lVar4 = local_c8;
  }
  this->m_max_keypool_index = lVar4;
  CPubKey::GetID((CKeyID *)&local_b0,&keypool->vchPubKey);
  pmVar2 = std::
           map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>::
           operator[](&this->m_pool_key_to_index,(key_type *)&local_b0);
  *pmVar2 = iVar1;
  CPubKey::GetID(&local_3c,&keypool->vchPubKey);
  cVar3 = std::
          _Rb_tree<CKeyID,_std::pair<const_CKeyID,_wallet::CKeyMetadata>,_std::_Select1st<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
          ::find(&(this->mapKeyMetadata)._M_t,&local_3c);
  if ((_Rb_tree_header *)cVar3._M_node == &(this->mapKeyMetadata)._M_t._M_impl.super__Rb_tree_header
     ) {
    CKeyMetadata::CKeyMetadata(&local_b0,keypool->nTime);
    std::
    map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
    ::operator[](&this->mapKeyMetadata,&local_3c);
    LoadKeyPool();
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_c0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void LegacyDataSPKM::LoadKeyPool(int64_t nIndex, const CKeyPool &keypool)
{
    LOCK(cs_KeyStore);
    if (keypool.m_pre_split) {
        set_pre_split_keypool.insert(nIndex);
    } else if (keypool.fInternal) {
        setInternalKeyPool.insert(nIndex);
    } else {
        setExternalKeyPool.insert(nIndex);
    }
    m_max_keypool_index = std::max(m_max_keypool_index, nIndex);
    m_pool_key_to_index[keypool.vchPubKey.GetID()] = nIndex;

    // If no metadata exists yet, create a default with the pool key's
    // creation time. Note that this may be overwritten by actually
    // stored metadata for that key later, which is fine.
    CKeyID keyid = keypool.vchPubKey.GetID();
    if (mapKeyMetadata.count(keyid) == 0)
        mapKeyMetadata[keyid] = CKeyMetadata(keypool.nTime);
}